

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O2

void __thiscall cmCMakePresetsGraph::TestPreset::TestPreset(TestPreset *this,TestPreset *param_1)

{
  Preset::Preset(&this->super_Preset,&param_1->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__TestPreset_00a9dc88;
  std::__cxx11::string::string((string *)&this->ConfigurePreset,(string *)&param_1->ConfigurePreset)
  ;
  (this->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> =
       (param_1->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
       super__Optional_payload_base<bool>;
  std::__cxx11::string::string((string *)&this->Configuration,(string *)&param_1->Configuration);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->OverwriteConfigurationFile,&param_1->OverwriteConfigurationFile);
  std::_Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>::_Optional_base
            (&(this->Output).
              super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>,
             &(param_1->Output).
              super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>);
  std::_Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>::_Optional_base
            (&(this->Filter).
              super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>,
             &(param_1->Filter).
              super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>);
  std::_Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>::
  _Optional_base(&(this->Execution).
                  super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                 ,&(param_1->Execution).
                   super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                );
  return;
}

Assistant:

TestPreset(const TestPreset& /*other*/) = default;